

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O0

int Abc_ObjSopSimulate(Abc_Obj_t *pObj)

{
  char *pSop_00;
  int iVar1;
  Abc_Obj_t *pAVar2;
  bool bVar3;
  uint local_38;
  uint local_34;
  int ResVar;
  int ResAnd;
  int ResOr;
  int v;
  int Value;
  int nVars;
  char *pSop;
  char *pCube;
  Abc_Obj_t *pObj_local;
  
  pSop_00 = (char *)(pObj->field_5).pData;
  if ((pSop_00 == (char *)0x0) || (iVar1 = Abc_SopIsExorType(pSop_00), iVar1 != 0)) {
    __assert_fail("pSop && !Abc_SopIsExorType(pSop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retInit.c"
                  ,0x61,"int Abc_ObjSopSimulate(Abc_Obj_t *)");
  }
  ResVar = 0;
  iVar1 = Abc_SopGetVarNum(pSop_00);
  pSop = pSop_00;
  do {
    if (*pSop == '\0') {
      iVar1 = Abc_SopGetPhase(pSop_00);
      if (iVar1 == 0) {
        ResVar = ResVar ^ 1;
      }
      return ResVar;
    }
    local_34 = 1;
    ResAnd = 0;
    while( true ) {
      bVar3 = false;
      if (pSop[ResAnd] != ' ') {
        ResOr = (int)pSop[ResAnd];
        bVar3 = ResOr != 0;
      }
      if (!bVar3) break;
      if (ResOr == 0x30) {
        pAVar2 = Abc_ObjFanin(pObj,ResAnd);
        local_38 = (pAVar2->field_6).iTemp ^ 1;
LAB_0057aca8:
        local_34 = local_38 & local_34;
      }
      else if (ResOr == 0x31) {
        pAVar2 = Abc_ObjFanin(pObj,ResAnd);
        local_38 = (pAVar2->field_6).iTemp;
        goto LAB_0057aca8;
      }
      ResAnd = ResAnd + 1;
    }
    ResVar = local_34 | ResVar;
    pSop = pSop + (iVar1 + 3);
  } while( true );
}

Assistant:

int Abc_ObjSopSimulate( Abc_Obj_t * pObj )
{
    char * pCube, * pSop = (char *)pObj->pData;
    int nVars, Value, v, ResOr, ResAnd, ResVar;
    assert( pSop && !Abc_SopIsExorType(pSop) );
    // simulate the SOP of the node
    ResOr = 0;
    nVars = Abc_SopGetVarNum(pSop);
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        ResAnd = 1;
        Abc_CubeForEachVar( pCube, Value, v )
        {
            if ( Value == '0' )
                ResVar = 1 ^ ((int)(ABC_PTRUINT_T)Abc_ObjFanin(pObj, v)->pCopy);
            else if ( Value == '1' )
                ResVar = (int)(ABC_PTRUINT_T)Abc_ObjFanin(pObj, v)->pCopy;
            else
                continue;
            ResAnd &= ResVar;
        }
        ResOr |= ResAnd;
    }
    // complement the result if necessary
    if ( !Abc_SopGetPhase(pSop) )
        ResOr ^= 1;
    return ResOr;
}